

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O2

Var Js::RegexHelper::RegexEs5ReplaceImpl
              (ScriptContext *scriptContext,JavascriptRegExp *regularExpression,
              JavascriptString *input,JavascriptString *replace,bool noResult)

{
  uint uVar1;
  char16 cVar2;
  CharCount startIndex;
  RegexPattern *pattern;
  RecyclableObject *nonMatchValue;
  Matcher *pMVar3;
  JavascriptString *this;
  bool isGlobal;
  bool bVar4;
  ushort uVar5;
  ushort uVar6;
  charcount_t cVar7;
  charcount_t inputLength;
  CharCountOrFlag offset;
  uint uVar8;
  uint uVar9;
  CharCount CVar10;
  CharCount startIndex_00;
  char16 *pcVar11;
  char16 *input_00;
  GroupInfo GVar12;
  ulong uVar13;
  RecyclableObject *aValue;
  JavascriptString *pJVar14;
  RegexPattern *extraout_RDX;
  RegexPattern *extraout_RDX_00;
  RegexPattern *extraout_RDX_01;
  RegexPattern *extraout_RDX_02;
  RegexPattern *pattern_00;
  RegexPattern *extraout_RDX_03;
  RegexPattern *extraout_RDX_04;
  ushort uVar15;
  undefined7 in_register_00000081;
  ulong uVar16;
  int i;
  ulong uVar17;
  undefined1 local_318 [8];
  Builder<256U> concatenated;
  RegexMatchState state;
  GroupInfo local_80;
  GroupInfo local_70;
  JavascriptString *local_68;
  charcount_t local_5c;
  JavascriptString *local_58;
  uint16 local_4a;
  GroupInfo local_48;
  GroupInfo lastActualMatch;
  
  pJVar14 = (JavascriptString *)CONCAT71(in_register_00000081,noResult);
  pattern = (regularExpression->pattern).ptr;
  pcVar11 = JavascriptString::GetString(replace);
  cVar7 = JavascriptString::GetLength(replace);
  input_00 = JavascriptString::GetString(input);
  inputLength = JavascriptString::GetLength(input);
  local_68 = replace;
  local_58 = input;
  RegexHelperTrace(scriptContext,(Use)regularExpression,(JavascriptRegExp *)input,replace,pJVar14);
  PrimBeginMatch((RegexMatchState *)&concatenated.isFinalized,scriptContext,pattern,input_00,
                 (CharCount)pJVar14,true);
  local_48.offset = 0;
  local_48.length = 0xffffffff;
  isGlobal = UnifiedRegex::RegexPattern::IsGlobal(pattern);
  lastActualMatch.length._3_1_ = UnifiedRegex::RegexPattern::IsSticky(pattern);
  offset = 0;
  if ((bool)lastActualMatch.length._3_1_ && !isGlobal) {
    offset = JavascriptRegExp::GetLastIndex(regularExpression);
  }
  if (noResult) {
    local_80.offset = 0;
    local_80.length = 0;
    uVar13 = 0xffffffffffffffff;
    do {
      if (inputLength < offset) {
        local_48.length = 0xffffffff;
        break;
      }
      GVar12 = PrimMatch((RegexMatchState *)&concatenated.isFinalized,scriptContext,pattern,
                         inputLength,offset);
      uVar16 = (ulong)GVar12 >> 0x20;
      local_48 = GVar12;
      if (uVar16 == 0xffffffff) break;
      if (uVar16 == 0) {
        offset = GVar12.offset + 1;
      }
      else {
        offset = UnifiedRegex::GroupInfo::EndOffset(&local_48);
      }
      uVar13 = uVar16;
      local_80 = GVar12;
    } while (isGlobal);
    pJVar14 = JavascriptLibrary::GetEmptyString
                        ((scriptContext->super_ScriptContextBase).javascriptLibrary);
    pattern_00 = extraout_RDX_03;
  }
  else {
    state.matcher = (Matcher *)0x0;
    uVar8 = GetReplaceSubstitutions
                      (pcVar11,cVar7,(ArenaAllocator *)(state.input + 4),
                       (CharCount **)&state.matcher);
    CompoundString::Builder<256U>::Builder((Builder<256U> *)local_318,scriptContext);
    if (offset != 0) {
      CVar10 = inputLength;
      if (offset < inputLength) {
        CVar10 = offset;
      }
      CompoundString::Builder<256U>::Append((Builder<256U> *)local_318,local_58,0,CVar10);
    }
    pMVar3 = state.matcher;
    local_80.offset = 0;
    local_80.length = 0;
    if ((int)uVar8 < 1) {
      uVar8 = 0;
    }
    uVar13 = 0xffffffffffffffff;
    do {
      if (inputLength < offset) {
        local_48.length = 0xffffffff;
        goto LAB_00bdeb32;
      }
      GVar12 = PrimMatch((RegexMatchState *)&concatenated.isFinalized,scriptContext,pattern,
                         inputLength,offset);
      pJVar14 = local_58;
      local_48 = GVar12;
      if ((ulong)GVar12 >> 0x20 == 0xffffffff) {
        uVar9 = (uint)uVar13;
        pattern_00 = (RegexPattern *)0xffffffff;
        break;
      }
      CompoundString::Builder<256U>::Append
                ((Builder<256U> *)local_318,local_58,offset,GVar12.offset - offset);
      if (pMVar3 == (Matcher *)0x0) {
        CompoundString::Builder<256U>::Append((Builder<256U> *)local_318,local_68);
        pattern_00 = extraout_RDX_00;
      }
      else {
        uVar13 = (ulong)local_48 & 0xffffffff;
        local_4a = UnifiedRegex::RegexPattern::NumGroups(pattern);
        local_70 = local_48;
        nonMatchValue =
             (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
        cVar7 = JavascriptString::GetLength(pJVar14);
        this = local_68;
        pcVar11 = JavascriptString::GetString(local_68);
        uVar9 = JavascriptString::GetLength(this);
        uVar16 = 0;
        local_5c = uVar9;
        for (uVar17 = 0; CVar10 = (CharCount)uVar16, uVar8 != uVar17; uVar17 = uVar17 + 1) {
          startIndex = *(CharCount *)((long)&(pMVar3->pattern).ptr + uVar17 * 4);
          CompoundString::Builder<256U>::Append
                    ((Builder<256U> *)local_318,local_68,CVar10,startIndex - CVar10);
          uVar16 = (ulong)(startIndex + 1);
          cVar2 = pcVar11[uVar16];
          uVar5 = cVar2 + L'￐';
          if (uVar5 < 10) {
            uVar1 = startIndex + 2;
            uVar16 = (ulong)uVar1;
            uVar6 = uVar5;
            if ((uVar1 < uVar9) && ((ushort)(pcVar11[uVar1] + L'￐') < 10)) {
              uVar15 = pcVar11[uVar1] + L'￐' + uVar5 * 10;
              uVar6 = uVar15;
              if (local_4a <= uVar15) {
                uVar6 = uVar5;
              }
              if (local_4a > uVar15) {
                uVar16 = (ulong)(startIndex + 3);
              }
            }
            if (uVar6 == 0 || local_4a <= uVar6) {
              CompoundString::Builder<256U>::Append
                        ((Builder<256U> *)local_318,local_68,startIndex,(int)uVar16 - startIndex);
            }
            else {
              aValue = (RecyclableObject *)
                       GetGroup(scriptContext,pattern,pJVar14,nonMatchValue,(uint)uVar6);
              bVar4 = VarIs<Js::JavascriptString>(aValue);
              if (bVar4) {
                pJVar14 = UnsafeVarTo<Js::JavascriptString>(aValue);
                CompoundString::Builder<256U>::Append((Builder<256U> *)local_318,pJVar14);
                pJVar14 = local_58;
                uVar9 = local_5c;
              }
              else {
                pJVar14 = local_58;
                uVar9 = local_5c;
                if (aValue != nonMatchValue) {
                  CompoundString::Builder<256U>::Append
                            ((Builder<256U> *)local_318,local_68,startIndex,(int)uVar16 - startIndex
                            );
                  pJVar14 = local_58;
                  uVar9 = local_5c;
                }
              }
            }
          }
          else {
            if (cVar2 == L'`') {
              startIndex_00 = 0;
              CVar10 = local_70.offset;
LAB_00bdea69:
              CompoundString::Builder<256U>::Append
                        ((Builder<256U> *)local_318,pJVar14,startIndex_00,CVar10);
            }
            else if (cVar2 == L'&') {
              CompoundString::Builder<256U>::Append
                        ((Builder<256U> *)local_318,input_00 + uVar13,local_70.length);
            }
            else if (cVar2 == L'\'') {
              CVar10 = UnifiedRegex::GroupInfo::EndOffset(&local_70);
              if (CVar10 < cVar7) {
                startIndex_00 = UnifiedRegex::GroupInfo::EndOffset(&local_70);
                CVar10 = UnifiedRegex::GroupInfo::EndOffset(&local_70);
                CVar10 = cVar7 - CVar10;
                goto LAB_00bdea69;
              }
            }
            else {
              if (cVar2 != L'$') {
                CompoundString::Builder<256U>::Append((Builder<256U> *)local_318,L'$');
                goto LAB_00bdea75;
              }
              CompoundString::Builder<256U>::Append((Builder<256U> *)local_318,L'$');
            }
            uVar16 = (ulong)(startIndex + 2);
          }
LAB_00bdea75:
        }
        CompoundString::Builder<256U>::Append
                  ((Builder<256U> *)local_318,local_68,CVar10,uVar9 - CVar10);
        pattern_00 = extraout_RDX;
      }
      if (local_48.length == 0) {
        if (local_48.offset < inputLength) {
          CompoundString::Builder<256U>::Append
                    ((Builder<256U> *)local_318,input_00[(ulong)local_48 & 0xffffffff]);
          pattern_00 = extraout_RDX_02;
        }
        offset = local_48.offset + 1;
      }
      else {
        offset = UnifiedRegex::GroupInfo::EndOffset(&local_48);
        pattern_00 = extraout_RDX_01;
      }
      uVar9 = GVar12.length;
      uVar13 = (ulong)GVar12 >> 0x20;
      local_80 = GVar12;
    } while (isGlobal);
    uVar13 = (ulong)uVar9;
    pJVar14 = local_58;
    if (offset != 0) {
LAB_00bdeb32:
      if (offset <= inputLength && inputLength - offset != 0) {
        CompoundString::Builder<256U>::Append
                  ((Builder<256U> *)local_318,local_58,offset,inputLength - offset);
      }
      pJVar14 = CompoundString::Builder<256U>::ToString((Builder<256U> *)local_318);
      pattern_00 = extraout_RDX_04;
    }
  }
  PrimEndMatch((RegexMatchState *)&concatenated.isFinalized,scriptContext,pattern_00);
  PropagateLastMatch(scriptContext,isGlobal,(bool)lastActualMatch.length._3_1_,regularExpression,
                     local_58,(GroupInfo)((ulong)local_80 & 0xffffffff | uVar13 << 0x20),local_48,
                     true,true,false);
  return pJVar14;
}

Assistant:

Var RegexHelper::RegexEs5ReplaceImpl(ScriptContext* scriptContext, JavascriptRegExp* regularExpression, JavascriptString* input, JavascriptString* replace, bool noResult)
    {
        UnifiedRegex::RegexPattern* pattern = regularExpression->GetPattern();
        const char16* replaceStr = replace->GetString();
        CharCount replaceLength = replace->GetLength();
        const char16* inputStr = input->GetString();
        CharCount inputLength = input->GetLength();

        JavascriptString* newString = nullptr;

#if ENABLE_REGEX_CONFIG_OPTIONS
        RegexHelperTrace(scriptContext, UnifiedRegex::RegexStats::Replace, regularExpression, input, replace);
#endif

        RegexMatchState state;
        PrimBeginMatch(state, scriptContext, pattern, inputStr, inputLength, true);

        UnifiedRegex::GroupInfo lastActualMatch;
        UnifiedRegex::GroupInfo lastSuccessfulMatch;
        const bool isGlobal = pattern->IsGlobal();
        const bool isSticky = pattern->IsSticky();

        // If global = false and sticky = true, set offset = lastIndex, else set offset = 0
        CharCount offset = 0;
        if (!isGlobal && isSticky)
        {
            offset = regularExpression->GetLastIndex();
        }

        if (!noResult)
        {
            CharCount* substitutionOffsets = nullptr;
            int substitutions = GetReplaceSubstitutions(replaceStr, replaceLength,
                 state.tempAllocatorObj->GetAllocator(), &substitutionOffsets);

            // Use to see if we already have partial result populated in concatenated
            CompoundString::Builder<64 * sizeof(void *) / sizeof(char16)> concatenated(scriptContext);

            // If lastIndex > 0, append input[0..offset] characters to the result
            if (offset > 0)
            {
                concatenated.Append(input, 0, min(offset, inputLength));
            }

            do
            {
                if (offset > inputLength)
                {
                    lastActualMatch.Reset();
                    break;
                }

                lastActualMatch = PrimMatch(state, scriptContext, pattern, inputLength, offset);

                if (lastActualMatch.IsUndefined())
                    break;

                lastSuccessfulMatch = lastActualMatch;
                concatenated.Append(input, offset, lastActualMatch.offset - offset);
                if (substitutionOffsets != 0)
                {
                    auto getGroup = [&](int captureIndex, Var nonMatchValue) {
                        return GetGroup(scriptContext, pattern, input, nonMatchValue, captureIndex);
                    };
                    const char16* matchedString = inputStr + lastActualMatch.offset;
                    ReplaceFormatString(scriptContext, pattern->NumGroups(), getGroup, input, matchedString, lastActualMatch, replace, substitutions, substitutionOffsets, concatenated);
                }
                else
                {
                    concatenated.Append(replace);
                }
                if (lastActualMatch.length == 0)
                {
                    if (lastActualMatch.offset < inputLength)
                    {
                        concatenated.Append(inputStr[lastActualMatch.offset]);
                    }
                    offset = lastActualMatch.offset + 1;
                }
                else
                {
                    offset = lastActualMatch.EndOffset();
                }
            }
            while (isGlobal);

            if (offset == 0)
            {
                // There was no successful match so the result is the input string.
                newString = input;
            }
            else
            {
                if (offset < inputLength)
                {
                    concatenated.Append(input, offset, inputLength - offset);
                }
                newString = concatenated.ToString();
            }
            substitutionOffsets = 0;
        }
        else
        {
            do
            {
                if (offset > inputLength)
                {
                    lastActualMatch.Reset();
                    break;
                }
                lastActualMatch = PrimMatch(state, scriptContext, pattern, inputLength, offset);

                if (lastActualMatch.IsUndefined())
                    break;

                lastSuccessfulMatch = lastActualMatch;
                offset = lastActualMatch.length == 0? lastActualMatch.offset + 1 : lastActualMatch.EndOffset();
            }
            while (isGlobal);
            newString = scriptContext->GetLibrary()->GetEmptyString();
        }

        PrimEndMatch(state, scriptContext, pattern);
        PropagateLastMatch(scriptContext, isGlobal, isSticky, regularExpression, input, lastSuccessfulMatch, lastActualMatch, true, true);
        return newString;
    }